

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.h
# Opt level: O0

void chacha20poly1305_init(ptls_aead_context_t *_ctx,uint64_t seq,void *aad,size_t aadlen)

{
  size_t sVar1;
  void *extraout_RDX;
  undefined1 local_78 [4];
  uint8_t auStack_74 [4];
  uint8_t tmpbuf [64];
  chacha20poly1305_context_t *ctx;
  size_t aadlen_local;
  void *aad_local;
  uint64_t seq_local;
  ptls_aead_context_t *_ctx_local;
  
  memset(local_78,0,4);
  ptls_aead__build_iv(_ctx->algo,auStack_74,(uint8_t *)&_ctx[1].dispose_crypto,seq);
  ptls_cipher_init((ptls_cipher_context_t *)_ctx[1].algo,local_78);
  memset(local_78,0,0x40);
  sVar1 = 0x40;
  ptls_cipher_encrypt((ptls_cipher_context_t *)_ctx[1].algo,local_78,local_78,0x40);
  (*_ctx[1].do_encrypt_update)(_ctx,local_78,extraout_RDX,sVar1);
  (*ptls_clear_memory)(local_78,0x40);
  if (aadlen != 0) {
    (*_ctx[1].do_encrypt_final)(_ctx,aad);
    chacha20poly1305_encrypt_pad((chacha20poly1305_context_t *)_ctx,aadlen);
  }
  _ctx[1].do_set_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)aadlen;
  _ctx[1].do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
  return;
}

Assistant:

static void chacha20poly1305_init(ptls_aead_context_t *_ctx, uint64_t seq, const void *aad, size_t aadlen)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;
    uint8_t tmpbuf[CHACHA20POLY1305_BLOCKSIZE];

    /* init chacha */
    memset(tmpbuf, 0, 16 - PTLS_CHACHA20POLY1305_IV_SIZE);
    ptls_aead__build_iv(ctx->super.algo, tmpbuf + 16 - PTLS_CHACHA20POLY1305_IV_SIZE, ctx->static_iv, seq);
    ptls_cipher_init(ctx->chacha, tmpbuf);

    /* init poly1305 */
    memset(tmpbuf, 0, sizeof(tmpbuf));
    ptls_cipher_encrypt(ctx->chacha, tmpbuf, tmpbuf, CHACHA20POLY1305_BLOCKSIZE);
    ctx->poly1305_init(ctx, tmpbuf);

    ptls_clear_memory(tmpbuf, sizeof(tmpbuf));

    /* aad */
    if (aadlen != 0) {
        ctx->poly1305_update(ctx, aad, aadlen);
        chacha20poly1305_encrypt_pad(ctx, aadlen);
    }

    ctx->aadlen = aadlen;
    ctx->textlen = 0;
}